

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

FLOAT __thiscall Matrix::mean(Matrix *this)

{
  int local_20;
  int local_1c;
  int32_t j;
  int32_t i;
  FLOAT mean;
  Matrix *this_local;
  
  _j = 0.0;
  for (local_1c = 0; local_1c < this->m; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->n; local_20 = local_20 + 1) {
      _j = this->val[local_1c][local_20] + _j;
    }
  }
  return _j / (double)(this->m * this->n);
}

Assistant:

FLOAT Matrix::mean () {
  FLOAT mean = 0;
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      mean += val[i][j];
  return mean/(FLOAT)(m*n);
}